

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

bool ImGui::SFML::UpdateFontTexture(void)

{
  bool bVar1;
  uint glTextureHandle;
  Texture *this;
  ImTextureID id;
  ImTextureID texID;
  Texture *texture;
  int height;
  int width;
  uchar *pixels;
  ImGuiIO *io;
  
  if ((anonymous_namespace)::s_currWindowCtx == 0) {
    __assert_fail("s_currWindowCtx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-sfml-src/imgui-SFML.cpp"
                  ,0x235,"bool ImGui::SFML::UpdateFontTexture()");
  }
  pixels = (uchar *)GetIO();
  ImFontAtlas::GetTexDataAsRGBA32
            (((ImGuiIO *)pixels)->Fonts,(uchar **)&height,(int *)((long)&texture + 4),
             (int *)&texture,(int *)0x0);
  this = (Texture *)((anonymous_namespace)::s_currWindowCtx + 0x10);
  bVar1 = sf::Texture::create(this,texture._4_4_,(uint)texture);
  if (bVar1) {
    sf::Texture::update(this,_height);
    glTextureHandle = sf::Texture::getNativeHandle(this);
    id = anon_unknown.dwarf_f6bf2::convertGLTextureHandleToImTextureID(glTextureHandle);
    ImFontAtlas::SetTexID(*(ImFontAtlas **)(pixels + 0x48),id);
  }
  return bVar1;
}

Assistant:

bool UpdateFontTexture() {
    assert(s_currWindowCtx);

    ImGuiIO& io = ImGui::GetIO();
    unsigned char* pixels;
    int width, height;

    io.Fonts->GetTexDataAsRGBA32(&pixels, &width, &height);

    sf::Texture& texture = s_currWindowCtx->fontTexture;
    if (!texture.create(width, height)) {
        return false;
    }

    texture.update(pixels);

    ImTextureID texID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());
    io.Fonts->SetTexID(texID);

    return true;
}